

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O1

void ImGui::ShowStyleEditor(ImGuiStyle *ref)

{
  ImFontAtlas *atlas;
  float fVar1;
  float fVar2;
  bool bVar3;
  uint uVar4;
  ImU32 col;
  ImGuiStyle *v;
  char *pcVar5;
  size_t sVar6;
  ImGuiIO *pIVar7;
  ImDrawList *this;
  ImVec4 *pIVar8;
  ImVec4 *pIVar9;
  int i_1;
  int iVar10;
  ImGuiStyle *__dest;
  int i;
  long lVar11;
  float fVar12;
  ImVec2 IVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  bool border;
  ImVec2 local_78;
  float *local_70;
  float local_64;
  ImGuiStyle *local_60;
  undefined1 local_58 [16];
  ImVec2 local_48;
  ImVec2 local_38;
  
  if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
    (*GImGuiDemoMarkerCallback)
              ("/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O1/_deps/imgui-src/imgui_demo.cpp"
               ,0x17fb,"Tools/Style Editor",GImGuiDemoMarkerCallbackUserData);
  }
  v = GetStyle();
  if (ShowStyleEditor(ImGuiStyle*)::ref_saved_style == '\0') {
    iVar10 = __cxa_guard_acquire(&ShowStyleEditor(ImGuiStyle*)::ref_saved_style);
    if (iVar10 != 0) {
      ImGuiStyle::ImGuiStyle(&ShowStyleEditor::ref_saved_style);
      __cxa_guard_release(&ShowStyleEditor(ImGuiStyle*)::ref_saved_style);
    }
  }
  if ((ref == (ImGuiStyle *)0x0) && ((ShowStyleEditor(ImGuiStyle*)::init & 1) == 0)) {
    memcpy(&ShowStyleEditor::ref_saved_style,v,0x418);
  }
  ShowStyleEditor(ImGuiStyle*)::init = 1;
  __dest = &ShowStyleEditor::ref_saved_style;
  if (ref != (ImGuiStyle *)0x0) {
    __dest = ref;
  }
  fVar12 = GetWindowWidth();
  PushItemWidth(fVar12 * 0.5);
  bVar3 = ShowStyleSelector("Colors##Selector");
  if (bVar3) {
    memcpy(&ShowStyleEditor::ref_saved_style,v,0x418);
  }
  ShowFontSelector("Fonts##Selector");
  bVar3 = SliderFloat("FrameRounding",&v->FrameRounding,0.0,12.0,"%.0f",0);
  if (bVar3) {
    v->GrabRounding = v->FrameRounding;
  }
  local_78.x._0_1_ = 0.0 < v->WindowBorderSize;
  bVar3 = Checkbox("WindowBorder",(bool *)&local_78);
  if (bVar3) {
    if (local_78.x._0_1_ == '\0') {
      fVar12 = 0.0;
    }
    else {
      fVar12 = 1.0;
    }
    v->WindowBorderSize = fVar12;
  }
  SameLine(0.0,-1.0);
  local_78.x._0_1_ = 0.0 < v->FrameBorderSize;
  bVar3 = Checkbox("FrameBorder",(bool *)&local_78);
  if (bVar3) {
    if (local_78.x._0_1_ == '\0') {
      fVar12 = 0.0;
    }
    else {
      fVar12 = 1.0;
    }
    v->FrameBorderSize = fVar12;
  }
  SameLine(0.0,-1.0);
  local_78.x._0_1_ = 0.0 < v->PopupBorderSize;
  bVar3 = Checkbox("PopupBorder",(bool *)&local_78);
  if (bVar3) {
    if (local_78.x._0_1_ == '\0') {
      fVar12 = 0.0;
    }
    else {
      fVar12 = 1.0;
    }
    v->PopupBorderSize = fVar12;
  }
  local_78.x = 0.0;
  local_78.y = 0.0;
  bVar3 = Button("Save Ref",&local_78);
  if (bVar3) {
    memcpy(&ShowStyleEditor::ref_saved_style,v,0x418);
    memmove(__dest,v,0x418);
  }
  SameLine(0.0,-1.0);
  local_78.x = 0.0;
  local_78.y = 0.0;
  bVar3 = Button("Revert Ref",&local_78);
  if (bVar3) {
    memcpy(v,__dest,0x418);
  }
  SameLine(0.0,-1.0);
  HelpMarker(
            "Save/Revert in local non-persistent storage. Default Colors definition are not affected. Use \"Export\" below to save them somewhere."
            );
  Separator();
  bVar3 = BeginTabBar("##tabs",0);
  if (bVar3) {
    bVar3 = BeginTabItem("Sizes",(bool *)0x0,0);
    if (bVar3) {
      Text("Main");
      local_70 = &v->FrameRounding;
      SliderFloat2("WindowPadding",&(v->WindowPadding).x,0.0,20.0,"%.0f",0);
      SliderFloat2("FramePadding",&(v->FramePadding).x,0.0,20.0,"%.0f",0);
      SliderFloat2("CellPadding",&(v->CellPadding).x,0.0,20.0,"%.0f",0);
      SliderFloat2("ItemSpacing",&(v->ItemSpacing).x,0.0,20.0,"%.0f",0);
      SliderFloat2("ItemInnerSpacing",&(v->ItemInnerSpacing).x,0.0,20.0,"%.0f",0);
      SliderFloat2("TouchExtraPadding",&(v->TouchExtraPadding).x,0.0,10.0,"%.0f",0);
      SliderFloat("IndentSpacing",&v->IndentSpacing,0.0,30.0,"%.0f",0);
      SliderFloat("ScrollbarSize",&v->ScrollbarSize,1.0,20.0,"%.0f",0);
      SliderFloat("GrabMinSize",&v->GrabMinSize,1.0,20.0,"%.0f",0);
      Text("Borders");
      SliderFloat("WindowBorderSize",&v->WindowBorderSize,0.0,1.0,"%.0f",0);
      SliderFloat("ChildBorderSize",&v->ChildBorderSize,0.0,1.0,"%.0f",0);
      SliderFloat("PopupBorderSize",&v->PopupBorderSize,0.0,1.0,"%.0f",0);
      SliderFloat("FrameBorderSize",&v->FrameBorderSize,0.0,1.0,"%.0f",0);
      SliderFloat("TabBorderSize",&v->TabBorderSize,0.0,1.0,"%.0f",0);
      Text("Rounding");
      SliderFloat("WindowRounding",&v->WindowRounding,0.0,12.0,"%.0f",0);
      SliderFloat("ChildRounding",&v->ChildRounding,0.0,12.0,"%.0f",0);
      SliderFloat("FrameRounding",local_70,0.0,12.0,"%.0f",0);
      SliderFloat("PopupRounding",&v->PopupRounding,0.0,12.0,"%.0f",0);
      SliderFloat("ScrollbarRounding",&v->ScrollbarRounding,0.0,12.0,"%.0f",0);
      SliderFloat("GrabRounding",&v->GrabRounding,0.0,12.0,"%.0f",0);
      SliderFloat("LogSliderDeadzone",&v->LogSliderDeadzone,0.0,12.0,"%.0f",0);
      SliderFloat("TabRounding",&v->TabRounding,0.0,12.0,"%.0f",0);
      Text("Alignment");
      SliderFloat2("WindowTitleAlign",&(v->WindowTitleAlign).x,0.0,1.0,"%.2f",0);
      local_78.x = (float)(v->WindowMenuButtonPosition + 1);
      bVar3 = Combo("WindowMenuButtonPosition",(int *)&local_78,"None",-1);
      if (bVar3) {
        v->WindowMenuButtonPosition = (int)local_78.x + -1;
      }
      Combo("ColorButtonPosition",&v->ColorButtonPosition,"Left",-1);
      SliderFloat2("ButtonTextAlign",&(v->ButtonTextAlign).x,0.0,1.0,"%.2f",0);
      SameLine(0.0,-1.0);
      HelpMarker("Alignment applies when a button is larger than its text content.");
      SliderFloat2("SelectableTextAlign",&(v->SelectableTextAlign).x,0.0,1.0,"%.2f",0);
      SameLine(0.0,-1.0);
      HelpMarker("Alignment applies when a selectable is larger than its text content.");
      Text("Safe Area Padding");
      SameLine(0.0,-1.0);
      HelpMarker(
                "Adjust if you cannot see the edges of your screen (e.g. on a TV where scaling has not been configured)."
                );
      SliderFloat2("DisplaySafeAreaPadding",&(v->DisplaySafeAreaPadding).x,0.0,30.0,"%.0f",0);
      EndTabItem();
    }
    bVar3 = BeginTabItem("Colors",(bool *)0x0,0);
    if (bVar3) {
      local_78.x = 0.0;
      local_78.y = 0.0;
      bVar3 = Button("Export",&local_78);
      if (bVar3) {
        local_60 = v;
        if (ShowStyleEditor::output_dest == 0) {
          LogToClipboard(-1);
        }
        else {
          LogToTTY(-1);
        }
        lVar11 = 0;
        LogText("ImVec4* colors = ImGui::GetStyle().Colors;\n");
        pIVar9 = local_60->Colors;
        pIVar8 = __dest->Colors;
        do {
          pcVar5 = GetStyleColorName((ImGuiCol)lVar11);
          if ((ShowStyleEditor::output_only_modified != true) ||
             (auVar14[0] = -(*(char *)&pIVar8->x == *(char *)&pIVar9->x),
             auVar14[1] = -(*(char *)((long)&pIVar8->x + 1) == *(char *)((long)&pIVar9->x + 1)),
             auVar14[2] = -(*(char *)((long)&pIVar8->x + 2) == *(char *)((long)&pIVar9->x + 2)),
             auVar14[3] = -(*(char *)((long)&pIVar8->x + 3) == *(char *)((long)&pIVar9->x + 3)),
             auVar14[4] = -(*(char *)&pIVar8->y == *(char *)&pIVar9->y),
             auVar14[5] = -(*(char *)((long)&pIVar8->y + 1) == *(char *)((long)&pIVar9->y + 1)),
             auVar14[6] = -(*(char *)((long)&pIVar8->y + 2) == *(char *)((long)&pIVar9->y + 2)),
             auVar14[7] = -(*(char *)((long)&pIVar8->y + 3) == *(char *)((long)&pIVar9->y + 3)),
             auVar14[8] = -(*(char *)&pIVar8->z == *(char *)&pIVar9->z),
             auVar14[9] = -(*(char *)((long)&pIVar8->z + 1) == *(char *)((long)&pIVar9->z + 1)),
             auVar14[10] = -(*(char *)((long)&pIVar8->z + 2) == *(char *)((long)&pIVar9->z + 2)),
             auVar14[0xb] = -(*(char *)((long)&pIVar8->z + 3) == *(char *)((long)&pIVar9->z + 3)),
             auVar14[0xc] = -(*(char *)&pIVar8->w == *(char *)&pIVar9->w),
             auVar14[0xd] = -(*(char *)((long)&pIVar8->w + 1) == *(char *)((long)&pIVar9->w + 1)),
             auVar14[0xe] = -(*(char *)((long)&pIVar8->w + 2) == *(char *)((long)&pIVar9->w + 2)),
             auVar14[0xf] = -(*(char *)((long)&pIVar8->w + 3) == *(char *)((long)&pIVar9->w + 3)),
             (ushort)((ushort)(SUB161(auVar14 >> 7,0) & 1) |
                      (ushort)(SUB161(auVar14 >> 0xf,0) & 1) << 1 |
                      (ushort)(SUB161(auVar14 >> 0x17,0) & 1) << 2 |
                      (ushort)(SUB161(auVar14 >> 0x1f,0) & 1) << 3 |
                      (ushort)(SUB161(auVar14 >> 0x27,0) & 1) << 4 |
                      (ushort)(SUB161(auVar14 >> 0x2f,0) & 1) << 5 |
                      (ushort)(SUB161(auVar14 >> 0x37,0) & 1) << 6 |
                      (ushort)(SUB161(auVar14 >> 0x3f,0) & 1) << 7 |
                      (ushort)(SUB161(auVar14 >> 0x47,0) & 1) << 8 |
                      (ushort)(SUB161(auVar14 >> 0x4f,0) & 1) << 9 |
                      (ushort)(SUB161(auVar14 >> 0x57,0) & 1) << 10 |
                      (ushort)(SUB161(auVar14 >> 0x5f,0) & 1) << 0xb |
                      (ushort)(SUB161(auVar14 >> 0x67,0) & 1) << 0xc |
                      (ushort)(SUB161(auVar14 >> 0x6f,0) & 1) << 0xd |
                      (ushort)(SUB161(auVar14 >> 0x77,0) & 1) << 0xe |
                     (ushort)(auVar14[0xf] >> 7) << 0xf) != 0xffff)) {
            sVar6 = strlen(pcVar5);
            LogText("colors[ImGuiCol_%s]%*s= ImVec4(%.2ff, %.2ff, %.2ff, %.2ff);\n",
                    (double)pIVar9->x,(double)pIVar9->y,(double)pIVar9->z,(double)pIVar9->w,pcVar5,
                    (ulong)(0x17 - (int)sVar6),"");
          }
          lVar11 = lVar11 + 1;
          pIVar8 = pIVar8 + 1;
          pIVar9 = pIVar9 + 1;
        } while (lVar11 != 0x35);
        LogFinish();
        v = local_60;
      }
      SameLine(0.0,-1.0);
      SetNextItemWidth(120.0);
      Combo("##output_type",&ShowStyleEditor::output_dest,"To Clipboard",-1);
      SameLine(0.0,-1.0);
      Checkbox("Only Modified Colors",&ShowStyleEditor::output_only_modified);
      if (ShowStyleEditor(ImGuiStyle*)::filter == '\0') {
        iVar10 = __cxa_guard_acquire(&ShowStyleEditor(ImGuiStyle*)::filter);
        if (iVar10 != 0) {
          ImGuiTextFilter::ImGuiTextFilter(&ShowStyleEditor::filter,"");
          __cxa_atexit(ImGuiTextFilter::~ImGuiTextFilter,&ShowStyleEditor::filter,&__dso_handle);
          __cxa_guard_release(&ShowStyleEditor(ImGuiStyle*)::filter);
        }
      }
      fVar12 = GetFontSize();
      ImGuiTextFilter::Draw(&ShowStyleEditor::filter,"Filter colors",fVar12 * 16.0);
      bVar3 = RadioButton("Opaque",ShowStyleEditor::alpha_flags == 0);
      if (bVar3) {
        ShowStyleEditor::alpha_flags = 0;
      }
      SameLine(0.0,-1.0);
      bVar3 = RadioButton("Alpha",ShowStyleEditor::alpha_flags == 0x20000);
      if (bVar3) {
        ShowStyleEditor::alpha_flags = 0x20000;
      }
      SameLine(0.0,-1.0);
      bVar3 = RadioButton("Both",ShowStyleEditor::alpha_flags == 0x40000);
      if (bVar3) {
        ShowStyleEditor::alpha_flags = 0x40000;
      }
      SameLine(0.0,-1.0);
      HelpMarker(
                "In the color list:\nLeft-click on color square to open color picker,\nRight-click to open edit options menu."
                );
      local_78.x = 0.0;
      local_78.y = 0.0;
      BeginChild("##colors",&local_78,true,0x80c000);
      PushItemWidth(-160.0);
      pIVar9 = v->Colors;
      pIVar8 = __dest->Colors;
      lVar11 = 0;
      do {
        pcVar5 = GetStyleColorName((ImGuiCol)lVar11);
        bVar3 = ImGuiTextFilter::PassFilter(&ShowStyleEditor::filter,pcVar5,(char *)0x0);
        if (bVar3) {
          PushID((ImGuiCol)lVar11);
          ColorEdit4("##color",&pIVar9->x,ShowStyleEditor::alpha_flags | 0x10000);
          auVar15[0] = -(*(char *)&pIVar8->x == *(char *)&pIVar9->x);
          auVar15[1] = -(*(char *)((long)&pIVar8->x + 1) == *(char *)((long)&pIVar9->x + 1));
          auVar15[2] = -(*(char *)((long)&pIVar8->x + 2) == *(char *)((long)&pIVar9->x + 2));
          auVar15[3] = -(*(char *)((long)&pIVar8->x + 3) == *(char *)((long)&pIVar9->x + 3));
          auVar15[4] = -(*(char *)&pIVar8->y == *(char *)&pIVar9->y);
          auVar15[5] = -(*(char *)((long)&pIVar8->y + 1) == *(char *)((long)&pIVar9->y + 1));
          auVar15[6] = -(*(char *)((long)&pIVar8->y + 2) == *(char *)((long)&pIVar9->y + 2));
          auVar15[7] = -(*(char *)((long)&pIVar8->y + 3) == *(char *)((long)&pIVar9->y + 3));
          auVar15[8] = -(*(char *)&pIVar8->z == *(char *)&pIVar9->z);
          auVar15[9] = -(*(char *)((long)&pIVar8->z + 1) == *(char *)((long)&pIVar9->z + 1));
          auVar15[10] = -(*(char *)((long)&pIVar8->z + 2) == *(char *)((long)&pIVar9->z + 2));
          auVar15[0xb] = -(*(char *)((long)&pIVar8->z + 3) == *(char *)((long)&pIVar9->z + 3));
          auVar15[0xc] = -(*(char *)&pIVar8->w == *(char *)&pIVar9->w);
          auVar15[0xd] = -(*(char *)((long)&pIVar8->w + 1) == *(char *)((long)&pIVar9->w + 1));
          auVar15[0xe] = -(*(char *)((long)&pIVar8->w + 2) == *(char *)((long)&pIVar9->w + 2));
          auVar15[0xf] = -(*(char *)((long)&pIVar8->w + 3) == *(char *)((long)&pIVar9->w + 3));
          if ((ushort)((ushort)(SUB161(auVar15 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar15 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar15 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar15 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar15 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar15 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar15 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar15 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar15 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar15 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar15 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar15 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar15 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar15 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar15 >> 0x77,0) & 1) << 0xe |
                      (ushort)(auVar15[0xf] >> 7) << 0xf) != 0xffff) {
            SameLine(0.0,(v->ItemInnerSpacing).x);
            local_78.x = 0.0;
            local_78.y = 0.0;
            bVar3 = Button("Save",&local_78);
            if (bVar3) {
              fVar12 = pIVar9->y;
              fVar1 = pIVar9->z;
              fVar2 = pIVar9->w;
              pIVar8->x = pIVar9->x;
              pIVar8->y = fVar12;
              pIVar8->z = fVar1;
              pIVar8->w = fVar2;
            }
            SameLine(0.0,(v->ItemInnerSpacing).x);
            local_78.x = 0.0;
            local_78.y = 0.0;
            bVar3 = Button("Revert",&local_78);
            if (bVar3) {
              fVar12 = pIVar8->y;
              fVar1 = pIVar8->z;
              fVar2 = pIVar8->w;
              pIVar9->x = pIVar8->x;
              pIVar9->y = fVar12;
              pIVar9->z = fVar1;
              pIVar9->w = fVar2;
            }
          }
          SameLine(0.0,(v->ItemInnerSpacing).x);
          TextUnformatted(pcVar5,(char *)0x0);
          PopID();
        }
        lVar11 = lVar11 + 1;
        pIVar8 = pIVar8 + 1;
        pIVar9 = pIVar9 + 1;
      } while (lVar11 != 0x35);
      PopItemWidth();
      EndChild();
      EndTabItem();
    }
    bVar3 = BeginTabItem("Fonts",(bool *)0x0,0);
    if (bVar3) {
      pIVar7 = GetIO();
      atlas = pIVar7->Fonts;
      HelpMarker("Read FAQ and docs/FONTS.md for details on font loading.");
      ShowFontAtlas(atlas);
      HelpMarker(
                "Those are old settings provided for convenience.\nHowever, the _correct_ way of scaling your UI is currently to reload your font at the designed size, rebuild the font atlas, and call style.ScaleAllSizes() on a reference ImGuiStyle structure.\nUsing those settings here will give you poor quality results."
                );
      fVar12 = GetFontSize();
      PushItemWidth(fVar12 * 8.0);
      bVar3 = DragFloat("window scale",&ShowStyleEditor::window_scale,0.005,0.3,2.0,"%.2f",0x10);
      if (bVar3) {
        SetWindowFontScale(ShowStyleEditor::window_scale);
      }
      DragFloat("global scale",&pIVar7->FontGlobalScale,0.005,0.3,2.0,"%.2f",0x10);
      PopItemWidth();
      EndTabItem();
    }
    bVar3 = BeginTabItem("Rendering",(bool *)0x0,0);
    if (bVar3) {
      Checkbox("Anti-aliased lines",&v->AntiAliasedLines);
      SameLine(0.0,-1.0);
      HelpMarker(
                "When disabling anti-aliasing lines, you\'ll probably want to disable borders in your style as well."
                );
      Checkbox("Anti-aliased lines use texture",&v->AntiAliasedLinesUseTex);
      SameLine(0.0,-1.0);
      HelpMarker(
                "Faster lines using texture data. Require backend to render with bilinear filtering (not point/nearest filtering)."
                );
      Checkbox("Anti-aliased fill",&v->AntiAliasedFill);
      fVar12 = GetFontSize();
      PushItemWidth(fVar12 * 8.0);
      DragFloat("Curve Tessellation Tolerance",&v->CurveTessellationTol,0.02,0.1,10.0,"%.2f",0);
      if (v->CurveTessellationTol <= 0.1 && v->CurveTessellationTol != 0.1) {
        v->CurveTessellationTol = 0.1;
      }
      DragFloat("Circle Tessellation Max Error",&v->CircleTessellationMaxError,0.005,0.1,5.0,"%.2f",
                0x10);
      bVar3 = IsItemActive();
      if (bVar3) {
        local_78 = GetCursorScreenPos();
        local_38.x = 0.0;
        local_38.y = 0.0;
        iVar10 = 0;
        SetNextWindowPos(&local_78,0,&local_38);
        BeginTooltip();
        TextUnformatted("(R = radius, N = number of segments)",(char *)0x0);
        Spacing();
        this = GetWindowDrawList();
        local_48 = CalcTextSize("N: MMM\nR: MMM",(char *)0x0,false,-1.0);
        do {
          local_70 = (float *)CONCAT44(local_70._4_4_,((float)iVar10 * 65.0) / 7.0 + 5.0);
          BeginGroup();
          local_58._0_8_ = (double)local_70._0_4_;
          uVar4 = ImDrawList::_CalcCircleAutoSegmentCount(this,local_70._0_4_);
          Text("R: %.f\nN: %d",local_58._0_8_,(ulong)uVar4);
          uVar4 = -(uint)(local_70._0_4_ + local_70._0_4_ <= local_48.x);
          fVar12 = (float)(~uVar4 & (uint)(local_70._0_4_ + local_70._0_4_) |
                          uVar4 & (uint)local_48.x);
          local_58 = ZEXT416((uint)fVar12);
          local_64 = floorf(fVar12 * 0.5);
          IVar13 = GetCursorScreenPos();
          local_78.y = IVar13.y + 70.0;
          local_78.x = local_64 + IVar13.x;
          col = GetColorU32(0,1.0);
          ImDrawList::AddCircle(this,&local_78,local_70._0_4_,col,0,1.0);
          local_78.y = 140.0;
          local_78.x = (float)local_58._0_4_;
          Dummy(&local_78);
          EndGroup();
          SameLine(0.0,-1.0);
          iVar10 = iVar10 + 1;
        } while (iVar10 != 8);
        EndTooltip();
      }
      SameLine(0.0,-1.0);
      HelpMarker(
                "When drawing circle primitives with \"num_segments == 0\" tesselation will be calculated automatically."
                );
      DragFloat("Global Alpha",&v->Alpha,0.005,0.2,1.0,"%.2f",0);
      DragFloat("Disabled Alpha",&v->DisabledAlpha,0.005,0.0,1.0,"%.2f",0);
      SameLine(0.0,-1.0);
      HelpMarker(
                "Additional alpha multiplier for disabled items (multiply over current value of Alpha)."
                );
      PopItemWidth();
      EndTabItem();
    }
    EndTabBar();
  }
  PopItemWidth();
  return;
}

Assistant:

void ImGui::ShowStyleEditor(ImGuiStyle* ref)
{
    IMGUI_DEMO_MARKER("Tools/Style Editor");
    // You can pass in a reference ImGuiStyle structure to compare to, revert to and save to
    // (without a reference style pointer, we will use one compared locally as a reference)
    ImGuiStyle& style = ImGui::GetStyle();
    static ImGuiStyle ref_saved_style;

    // Default to using internal storage as reference
    static bool init = true;
    if (init && ref == NULL)
        ref_saved_style = style;
    init = false;
    if (ref == NULL)
        ref = &ref_saved_style;

    ImGui::PushItemWidth(ImGui::GetWindowWidth() * 0.50f);

    if (ImGui::ShowStyleSelector("Colors##Selector"))
        ref_saved_style = style;
    ImGui::ShowFontSelector("Fonts##Selector");

    // Simplified Settings (expose floating-pointer border sizes as boolean representing 0.0f or 1.0f)
    if (ImGui::SliderFloat("FrameRounding", &style.FrameRounding, 0.0f, 12.0f, "%.0f"))
        style.GrabRounding = style.FrameRounding; // Make GrabRounding always the same value as FrameRounding
    { bool border = (style.WindowBorderSize > 0.0f); if (ImGui::Checkbox("WindowBorder", &border)) { style.WindowBorderSize = border ? 1.0f : 0.0f; } }
    ImGui::SameLine();
    { bool border = (style.FrameBorderSize > 0.0f);  if (ImGui::Checkbox("FrameBorder",  &border)) { style.FrameBorderSize  = border ? 1.0f : 0.0f; } }
    ImGui::SameLine();
    { bool border = (style.PopupBorderSize > 0.0f);  if (ImGui::Checkbox("PopupBorder",  &border)) { style.PopupBorderSize  = border ? 1.0f : 0.0f; } }

    // Save/Revert button
    if (ImGui::Button("Save Ref"))
        *ref = ref_saved_style = style;
    ImGui::SameLine();
    if (ImGui::Button("Revert Ref"))
        style = *ref;
    ImGui::SameLine();
    HelpMarker(
        "Save/Revert in local non-persistent storage. Default Colors definition are not affected. "
        "Use \"Export\" below to save them somewhere.");

    ImGui::Separator();

    if (ImGui::BeginTabBar("##tabs", ImGuiTabBarFlags_None))
    {
        if (ImGui::BeginTabItem("Sizes"))
        {
            ImGui::Text("Main");
            ImGui::SliderFloat2("WindowPadding", (float*)&style.WindowPadding, 0.0f, 20.0f, "%.0f");
            ImGui::SliderFloat2("FramePadding", (float*)&style.FramePadding, 0.0f, 20.0f, "%.0f");
            ImGui::SliderFloat2("CellPadding", (float*)&style.CellPadding, 0.0f, 20.0f, "%.0f");
            ImGui::SliderFloat2("ItemSpacing", (float*)&style.ItemSpacing, 0.0f, 20.0f, "%.0f");
            ImGui::SliderFloat2("ItemInnerSpacing", (float*)&style.ItemInnerSpacing, 0.0f, 20.0f, "%.0f");
            ImGui::SliderFloat2("TouchExtraPadding", (float*)&style.TouchExtraPadding, 0.0f, 10.0f, "%.0f");
            ImGui::SliderFloat("IndentSpacing", &style.IndentSpacing, 0.0f, 30.0f, "%.0f");
            ImGui::SliderFloat("ScrollbarSize", &style.ScrollbarSize, 1.0f, 20.0f, "%.0f");
            ImGui::SliderFloat("GrabMinSize", &style.GrabMinSize, 1.0f, 20.0f, "%.0f");
            ImGui::Text("Borders");
            ImGui::SliderFloat("WindowBorderSize", &style.WindowBorderSize, 0.0f, 1.0f, "%.0f");
            ImGui::SliderFloat("ChildBorderSize", &style.ChildBorderSize, 0.0f, 1.0f, "%.0f");
            ImGui::SliderFloat("PopupBorderSize", &style.PopupBorderSize, 0.0f, 1.0f, "%.0f");
            ImGui::SliderFloat("FrameBorderSize", &style.FrameBorderSize, 0.0f, 1.0f, "%.0f");
            ImGui::SliderFloat("TabBorderSize", &style.TabBorderSize, 0.0f, 1.0f, "%.0f");
            ImGui::Text("Rounding");
            ImGui::SliderFloat("WindowRounding", &style.WindowRounding, 0.0f, 12.0f, "%.0f");
            ImGui::SliderFloat("ChildRounding", &style.ChildRounding, 0.0f, 12.0f, "%.0f");
            ImGui::SliderFloat("FrameRounding", &style.FrameRounding, 0.0f, 12.0f, "%.0f");
            ImGui::SliderFloat("PopupRounding", &style.PopupRounding, 0.0f, 12.0f, "%.0f");
            ImGui::SliderFloat("ScrollbarRounding", &style.ScrollbarRounding, 0.0f, 12.0f, "%.0f");
            ImGui::SliderFloat("GrabRounding", &style.GrabRounding, 0.0f, 12.0f, "%.0f");
            ImGui::SliderFloat("LogSliderDeadzone", &style.LogSliderDeadzone, 0.0f, 12.0f, "%.0f");
            ImGui::SliderFloat("TabRounding", &style.TabRounding, 0.0f, 12.0f, "%.0f");
            ImGui::Text("Alignment");
            ImGui::SliderFloat2("WindowTitleAlign", (float*)&style.WindowTitleAlign, 0.0f, 1.0f, "%.2f");
            int window_menu_button_position = style.WindowMenuButtonPosition + 1;
            if (ImGui::Combo("WindowMenuButtonPosition", (int*)&window_menu_button_position, "None\0Left\0Right\0"))
                style.WindowMenuButtonPosition = window_menu_button_position - 1;
            ImGui::Combo("ColorButtonPosition", (int*)&style.ColorButtonPosition, "Left\0Right\0");
            ImGui::SliderFloat2("ButtonTextAlign", (float*)&style.ButtonTextAlign, 0.0f, 1.0f, "%.2f");
            ImGui::SameLine(); HelpMarker("Alignment applies when a button is larger than its text content.");
            ImGui::SliderFloat2("SelectableTextAlign", (float*)&style.SelectableTextAlign, 0.0f, 1.0f, "%.2f");
            ImGui::SameLine(); HelpMarker("Alignment applies when a selectable is larger than its text content.");
            ImGui::Text("Safe Area Padding");
            ImGui::SameLine(); HelpMarker("Adjust if you cannot see the edges of your screen (e.g. on a TV where scaling has not been configured).");
            ImGui::SliderFloat2("DisplaySafeAreaPadding", (float*)&style.DisplaySafeAreaPadding, 0.0f, 30.0f, "%.0f");
            ImGui::EndTabItem();
        }

        if (ImGui::BeginTabItem("Colors"))
        {
            static int output_dest = 0;
            static bool output_only_modified = true;
            if (ImGui::Button("Export"))
            {
                if (output_dest == 0)
                    ImGui::LogToClipboard();
                else
                    ImGui::LogToTTY();
                ImGui::LogText("ImVec4* colors = ImGui::GetStyle().Colors;" IM_NEWLINE);
                for (int i = 0; i < ImGuiCol_COUNT; i++)
                {
                    const ImVec4& col = style.Colors[i];
                    const char* name = ImGui::GetStyleColorName(i);
                    if (!output_only_modified || memcmp(&col, &ref->Colors[i], sizeof(ImVec4)) != 0)
                        ImGui::LogText("colors[ImGuiCol_%s]%*s= ImVec4(%.2ff, %.2ff, %.2ff, %.2ff);" IM_NEWLINE,
                            name, 23 - (int)strlen(name), "", col.x, col.y, col.z, col.w);
                }
                ImGui::LogFinish();
            }
            ImGui::SameLine(); ImGui::SetNextItemWidth(120); ImGui::Combo("##output_type", &output_dest, "To Clipboard\0To TTY\0");
            ImGui::SameLine(); ImGui::Checkbox("Only Modified Colors", &output_only_modified);

            static ImGuiTextFilter filter;
            filter.Draw("Filter colors", ImGui::GetFontSize() * 16);

            static ImGuiColorEditFlags alpha_flags = 0;
            if (ImGui::RadioButton("Opaque", alpha_flags == ImGuiColorEditFlags_None))             { alpha_flags = ImGuiColorEditFlags_None; } ImGui::SameLine();
            if (ImGui::RadioButton("Alpha",  alpha_flags == ImGuiColorEditFlags_AlphaPreview))     { alpha_flags = ImGuiColorEditFlags_AlphaPreview; } ImGui::SameLine();
            if (ImGui::RadioButton("Both",   alpha_flags == ImGuiColorEditFlags_AlphaPreviewHalf)) { alpha_flags = ImGuiColorEditFlags_AlphaPreviewHalf; } ImGui::SameLine();
            HelpMarker(
                "In the color list:\n"
                "Left-click on color square to open color picker,\n"
                "Right-click to open edit options menu.");

            ImGui::BeginChild("##colors", ImVec2(0, 0), true, ImGuiWindowFlags_AlwaysVerticalScrollbar | ImGuiWindowFlags_AlwaysHorizontalScrollbar | ImGuiWindowFlags_NavFlattened);
            ImGui::PushItemWidth(-160);
            for (int i = 0; i < ImGuiCol_COUNT; i++)
            {
                const char* name = ImGui::GetStyleColorName(i);
                if (!filter.PassFilter(name))
                    continue;
                ImGui::PushID(i);
                ImGui::ColorEdit4("##color", (float*)&style.Colors[i], ImGuiColorEditFlags_AlphaBar | alpha_flags);
                if (memcmp(&style.Colors[i], &ref->Colors[i], sizeof(ImVec4)) != 0)
                {
                    // Tips: in a real user application, you may want to merge and use an icon font into the main font,
                    // so instead of "Save"/"Revert" you'd use icons!
                    // Read the FAQ and docs/FONTS.md about using icon fonts. It's really easy and super convenient!
                    ImGui::SameLine(0.0f, style.ItemInnerSpacing.x); if (ImGui::Button("Save")) { ref->Colors[i] = style.Colors[i]; }
                    ImGui::SameLine(0.0f, style.ItemInnerSpacing.x); if (ImGui::Button("Revert")) { style.Colors[i] = ref->Colors[i]; }
                }
                ImGui::SameLine(0.0f, style.ItemInnerSpacing.x);
                ImGui::TextUnformatted(name);
                ImGui::PopID();
            }
            ImGui::PopItemWidth();
            ImGui::EndChild();

            ImGui::EndTabItem();
        }

        if (ImGui::BeginTabItem("Fonts"))
        {
            ImGuiIO& io = ImGui::GetIO();
            ImFontAtlas* atlas = io.Fonts;
            HelpMarker("Read FAQ and docs/FONTS.md for details on font loading.");
            ImGui::ShowFontAtlas(atlas);

            // Post-baking font scaling. Note that this is NOT the nice way of scaling fonts, read below.
            // (we enforce hard clamping manually as by default DragFloat/SliderFloat allows CTRL+Click text to get out of bounds).
            const float MIN_SCALE = 0.3f;
            const float MAX_SCALE = 2.0f;
            HelpMarker(
                "Those are old settings provided for convenience.\n"
                "However, the _correct_ way of scaling your UI is currently to reload your font at the designed size, "
                "rebuild the font atlas, and call style.ScaleAllSizes() on a reference ImGuiStyle structure.\n"
                "Using those settings here will give you poor quality results.");
            static float window_scale = 1.0f;
            ImGui::PushItemWidth(ImGui::GetFontSize() * 8);
            if (ImGui::DragFloat("window scale", &window_scale, 0.005f, MIN_SCALE, MAX_SCALE, "%.2f", ImGuiSliderFlags_AlwaysClamp)) // Scale only this window
                ImGui::SetWindowFontScale(window_scale);
            ImGui::DragFloat("global scale", &io.FontGlobalScale, 0.005f, MIN_SCALE, MAX_SCALE, "%.2f", ImGuiSliderFlags_AlwaysClamp); // Scale everything
            ImGui::PopItemWidth();

            ImGui::EndTabItem();
        }

        if (ImGui::BeginTabItem("Rendering"))
        {
            ImGui::Checkbox("Anti-aliased lines", &style.AntiAliasedLines);
            ImGui::SameLine();
            HelpMarker("When disabling anti-aliasing lines, you'll probably want to disable borders in your style as well.");

            ImGui::Checkbox("Anti-aliased lines use texture", &style.AntiAliasedLinesUseTex);
            ImGui::SameLine();
            HelpMarker("Faster lines using texture data. Require backend to render with bilinear filtering (not point/nearest filtering).");

            ImGui::Checkbox("Anti-aliased fill", &style.AntiAliasedFill);
            ImGui::PushItemWidth(ImGui::GetFontSize() * 8);
            ImGui::DragFloat("Curve Tessellation Tolerance", &style.CurveTessellationTol, 0.02f, 0.10f, 10.0f, "%.2f");
            if (style.CurveTessellationTol < 0.10f) style.CurveTessellationTol = 0.10f;

            // When editing the "Circle Segment Max Error" value, draw a preview of its effect on auto-tessellated circles.
            ImGui::DragFloat("Circle Tessellation Max Error", &style.CircleTessellationMaxError , 0.005f, 0.10f, 5.0f, "%.2f", ImGuiSliderFlags_AlwaysClamp);
            if (ImGui::IsItemActive())
            {
                ImGui::SetNextWindowPos(ImGui::GetCursorScreenPos());
                ImGui::BeginTooltip();
                ImGui::TextUnformatted("(R = radius, N = number of segments)");
                ImGui::Spacing();
                ImDrawList* draw_list = ImGui::GetWindowDrawList();
                const float min_widget_width = ImGui::CalcTextSize("N: MMM\nR: MMM").x;
                for (int n = 0; n < 8; n++)
                {
                    const float RAD_MIN = 5.0f;
                    const float RAD_MAX = 70.0f;
                    const float rad = RAD_MIN + (RAD_MAX - RAD_MIN) * (float)n / (8.0f - 1.0f);

                    ImGui::BeginGroup();

                    ImGui::Text("R: %.f\nN: %d", rad, draw_list->_CalcCircleAutoSegmentCount(rad));

                    const float canvas_width = IM_MAX(min_widget_width, rad * 2.0f);
                    const float offset_x     = floorf(canvas_width * 0.5f);
                    const float offset_y     = floorf(RAD_MAX);

                    const ImVec2 p1 = ImGui::GetCursorScreenPos();
                    draw_list->AddCircle(ImVec2(p1.x + offset_x, p1.y + offset_y), rad, ImGui::GetColorU32(ImGuiCol_Text));
                    ImGui::Dummy(ImVec2(canvas_width, RAD_MAX * 2));

                    /*
                    const ImVec2 p2 = ImGui::GetCursorScreenPos();
                    draw_list->AddCircleFilled(ImVec2(p2.x + offset_x, p2.y + offset_y), rad, ImGui::GetColorU32(ImGuiCol_Text));
                    ImGui::Dummy(ImVec2(canvas_width, RAD_MAX * 2));
                    */

                    ImGui::EndGroup();
                    ImGui::SameLine();
                }
                ImGui::EndTooltip();
            }
            ImGui::SameLine();
            HelpMarker("When drawing circle primitives with \"num_segments == 0\" tesselation will be calculated automatically.");

            ImGui::DragFloat("Global Alpha", &style.Alpha, 0.005f, 0.20f, 1.0f, "%.2f"); // Not exposing zero here so user doesn't "lose" the UI (zero alpha clips all widgets). But application code could have a toggle to switch between zero and non-zero.
            ImGui::DragFloat("Disabled Alpha", &style.DisabledAlpha, 0.005f, 0.0f, 1.0f, "%.2f"); ImGui::SameLine(); HelpMarker("Additional alpha multiplier for disabled items (multiply over current value of Alpha).");
            ImGui::PopItemWidth();

            ImGui::EndTabItem();
        }

        ImGui::EndTabBar();
    }

    ImGui::PopItemWidth();
}